

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_memcpy_fallback.cc
# Opt level: O2

crc32c_t __thiscall
absl::lts_20240722::crc_internal::FallbackCrcMemcpyEngine::Compute
          (FallbackCrcMemcpyEngine *this,void *dst,void *src,size_t length,crc32c_t initial_crc)

{
  char *pcVar1;
  size_t final_copy_size;
  size_t __n;
  ulong uVar2;
  string_view buf_to_add;
  string_view buf_to_add_00;
  
  pcVar1 = (char *)length;
  uVar2 = 0;
  while (uVar2 + 0x2000 < length) {
    buf_to_add._M_str = pcVar1;
    buf_to_add._M_len = (size_t)((long)src + uVar2);
    initial_crc = ExtendCrc32cInternal
                            ((crc_internal *)(ulong)initial_crc.crc_,(crc32c_t)0x2000,buf_to_add);
    memcpy((void *)(uVar2 + (long)dst),(void *)((long)src + uVar2),0x2000);
    uVar2 = uVar2 + 0x2000;
  }
  __n = length - uVar2;
  if (uVar2 <= length && __n != 0) {
    buf_to_add_00._M_str = pcVar1;
    buf_to_add_00._M_len = (size_t)((long)src + uVar2);
    initial_crc = ExtendCrc32cInternal
                            ((crc_internal *)(ulong)initial_crc.crc_,(uint32_t)__n,buf_to_add_00);
    memcpy((void *)((long)dst + uVar2),(void *)((long)src + uVar2),__n);
  }
  return (crc32c_t)initial_crc.crc_;
}

Assistant:

absl::crc32c_t FallbackCrcMemcpyEngine::Compute(void* __restrict dst,
                                                const void* __restrict src,
                                                std::size_t length,
                                                crc32c_t initial_crc) const {
  constexpr size_t kBlockSize = 8192;
  absl::crc32c_t crc = initial_crc;

  const char* src_bytes = reinterpret_cast<const char*>(src);
  char* dst_bytes = reinterpret_cast<char*>(dst);

  // Copy + CRC loop - run 8k chunks until we are out of full chunks.  CRC
  // then copy was found to be slightly more efficient in our test cases.
  std::size_t offset = 0;
  for (; offset + kBlockSize < length; offset += kBlockSize) {
    crc = absl::ExtendCrc32c(crc,
                             absl::string_view(src_bytes + offset, kBlockSize));
    memcpy(dst_bytes + offset, src_bytes + offset, kBlockSize);
  }

  // Save some work if length is 0.
  if (offset < length) {
    std::size_t final_copy_size = length - offset;
    crc = absl::ExtendCrc32c(
        crc, absl::string_view(src_bytes + offset, final_copy_size));
    memcpy(dst_bytes + offset, src_bytes + offset, final_copy_size);
  }

  return crc;
}